

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coll.cpp
# Opt level: O0

int32_t icu_63::anon_unknown_7::getReorderCode(char *s)

{
  int iVar1;
  int local_1c;
  int32_t i;
  char *s_local;
  
  local_1c = 0;
  while( true ) {
    if (4 < local_1c) {
      return -1;
    }
    iVar1 = uprv_stricmp_63(s,*(char **)((anonymous_namespace)::collReorderCodes +
                                        (long)local_1c * 8));
    if (iVar1 == 0) break;
    local_1c = local_1c + 1;
  }
  return local_1c + 0x1000;
}

Assistant:

int32_t getReorderCode(const char *s) {
    for (int32_t i = 0; i < UPRV_LENGTHOF(collReorderCodes); ++i) {
        if (uprv_stricmp(s, collReorderCodes[i]) == 0) {
            return UCOL_REORDER_CODE_FIRST + i;
        }
    }
    // Not supporting "others" = UCOL_REORDER_CODE_OTHERS
    // as a synonym for Zzzz = USCRIPT_UNKNOWN for now:
    // Avoid introducing synonyms/aliases.
    return -1;
}